

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidgetItem::QTreeWidgetItem(QTreeWidgetItem *this,int type)

{
  long lVar1;
  QFlags<Qt::ItemFlag> QVar2;
  QTreeWidgetItem *item;
  undefined4 in_ESI;
  QTreeWidgetItemPrivate *in_RDI;
  long in_FS_OFFSET;
  ItemFlag other;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->q = (QTreeWidgetItem *)&PTR__QTreeWidgetItem_00d31678;
  *(undefined4 *)&(in_RDI->display).d.d = in_ESI;
  QList<QList<QWidgetItemData>_>::QList((QList<QList<QWidgetItemData>_> *)0x912bb7);
  *(undefined8 *)&in_RDI->policy = 0;
  item = (QTreeWidgetItem *)operator_new(0x30);
  QTreeWidgetItemPrivate::QTreeWidgetItemPrivate(in_RDI,item);
  in_RDI[1].q = item;
  in_RDI[1].display.d.d = (Data *)0x0;
  QList<QTreeWidgetItem_*>::QList((QList<QTreeWidgetItem_*> *)0x912bfd);
  other = (ItemFlag)((ulong)item >> 0x20);
  Qt::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
  QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)in_RDI,other);
  QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)in_RDI,other);
  QVar2 = QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)in_RDI,other);
  in_RDI[1].policy =
       (ChildIndicatorPolicy)
       QVar2.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(int type) : rtti(type), d(new QTreeWidgetItemPrivate(this)) { }